

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O2

void __thiscall WorkerStream::start(WorkerStream *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  _Self __tmp;
  
  p_Var1 = &(this->m_flows)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this->m_flows)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    WorkerFlow::ready((WorkerFlow *)**(undefined8 **)(p_Var4 + 2));
  }
  do {
    bVar5 = false;
    for (p_Var4 = (this->m_flows)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      bVar2 = bVar5;
      if (*(char *)(*(undefined8 **)(p_Var4 + 2) + 1) == '\0') {
        bVar3 = WorkerFlow::work((WorkerFlow *)**(undefined8 **)(p_Var4 + 2));
        bVar2 = true;
        if (!bVar3) {
          *(undefined1 *)(*(long *)(p_Var4 + 2) + 8) = 1;
          bVar2 = bVar5;
        }
      }
      bVar5 = bVar2;
    }
  } while (bVar5);
  return;
}

Assistant:

void WorkerStream::start() 
{
    typedef std::map<std::string, WorkerWrapper*>::iterator it_type;

    // tell each worker that it is ready to begin working.
    for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
        it->second->flow->ready();
    }

    // this flag will tell us if some flow isn't stopped, and iterate again.
    bool not_done = true;

    while (not_done) {
        not_done = false;

        // loop each flow.
        for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
            // if the flow is stopped, skip it.
            if (it->second->stopped) {
                continue;
            }

            // if the flow work() returns true, then there's more work to be
            // done.
            if (it->second->flow->work()) {
                // set the flag to true to iterate again.
                not_done = true;
            } else {
                // set this flow as stopped, in order to skip it.
                it->second->stopped = true;
            }
        }
    }
}